

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void luaD_call(lua_State *L,StkId func,int nResults)

{
  ushort uVar1;
  int iVar2;
  
  uVar1 = L->nCcalls + 1;
  L->nCcalls = uVar1;
  if (199 < uVar1) {
    if (uVar1 == 200) {
      luaG_runerror(L,"C stack overflow");
    }
    if (0xe0 < uVar1) {
      luaD_throw(L,6);
    }
  }
  iVar2 = luaD_precall(L,func,nResults);
  if (iVar2 == 0) {
    luaV_execute(L);
  }
  L->nCcalls = L->nCcalls - 1;
  return;
}

Assistant:

void luaD_call(lua_State *L, StkId func, int nResults) {
    if (++L->nCcalls >= LUAI_MAXCCALLS)
        stackerror(L);
    if (!luaD_precall(L, func, nResults))  /* is a Lua function? */
        luaV_execute(L);  /* call it */
    L->nCcalls--;
}